

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O0

void __thiscall ktxApp::usage(ktxApp *this)

{
  std::operator<<((ostream *)&std::cerr,
                  "  -h, --help    Print this usage message and exit.\n  -v, --version Print the version number of this program and exit.\n"
                 );
  return;
}

Assistant:

virtual void usage() {
        cerr <<
            "  -h, --help    Print this usage message and exit.\n"
            "  -v, --version Print the version number of this program and exit.\n"
#if defined(_WIN32) && defined(DEBUG)
            "      --ld      Launch Visual Studio deugger at start up.\n"
#endif
            ;
    }